

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

type fmt::v5::
     visit_format_arg<fmt::v5::internal::printf_precision_handler,fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char,fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>>>
               (printf_precision_handler *vis,
               basic_format_arg<fmt::v5::basic_printf_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char,_fmt::v5::printf_arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>_>_>
               *arg)

{
  basic_string_view<char> bVar1;
  type_conflict5 tVar2;
  format_error *this;
  
  switch(arg->type_) {
  case int_type:
    return (arg->value_).field_0.int_value;
  case uint_type:
    tVar2 = internal::printf_precision_handler::operator()(vis,(arg->value_).field_0.uint_value);
    return tVar2;
  case long_long_type:
    tVar2 = internal::printf_precision_handler::operator()
                      (vis,(arg->value_).field_0.long_long_value);
    return tVar2;
  case ulong_long_type:
    tVar2 = internal::printf_precision_handler::operator()
                      (vis,(arg->value_).field_0.ulong_long_value);
    return tVar2;
  case bool_type:
    return (type)((arg->value_).field_0.int_value != 0);
  case char_type:
    return (int)*(char *)&(arg->value_).field_0;
  case double_type:
    tVar2 = internal::printf_precision_handler::operator()(vis,(arg->value_).field_0.double_value);
    return tVar2;
  case last_numeric_type:
    tVar2 = internal::printf_precision_handler::operator()
                      (vis,(arg->value_).field_0.long_double_value);
    return tVar2;
  case cstring_type:
    tVar2 = internal::printf_precision_handler::operator()(vis,(arg->value_).field_0.string.value);
    return tVar2;
  case string_type:
    bVar1.data_ = *(char **)&(arg->value_).field_0;
    bVar1.size_ = *(size_t *)((long)&(arg->value_).field_0 + 8);
    tVar2 = internal::printf_precision_handler::operator()(vis,bVar1);
    return tVar2;
  case pointer_type:
    tVar2 = internal::printf_precision_handler::operator()(vis,(arg->value_).field_0.pointer);
    return tVar2;
  case custom_type:
    tVar2 = internal::printf_precision_handler::operator()(vis,(handle)(arg->value_).field_0.string)
    ;
    return tVar2;
  default:
    this = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this,"precision is not integer");
    __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}